

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

QString * __thiscall
QtPrivate::QStringList_join
          (QString *__return_storage_ptr__,QtPrivate *this,QStringList *list,QLatin1StringView sep)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  QStringList *__range2;
  QString *str;
  QLatin1StringView str_00;
  
  pcVar4 = sep.m_data;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(this + 0x10) != 0) {
    lVar5 = 0;
    pcVar6 = (char *)0x0;
    do {
      pcVar6 = pcVar4 + (long)(pcVar6 + *(long *)(*(long *)(this + 8) + 0x10 + lVar5));
      lVar5 = lVar5 + 0x18;
    } while (*(long *)(this + 0x10) * 0x18 != lVar5);
    lVar5 = (long)pcVar6 - (long)pcVar4;
    pDVar2 = (__return_storage_ptr__->d).d;
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar2->super_QArrayData).alloc -
        ((long)((long)(__return_storage_ptr__->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar5)) {
      lVar3 = (__return_storage_ptr__->d).size;
      if (lVar5 < lVar3) {
        lVar5 = lVar3;
      }
      QString::reallocData(__return_storage_ptr__,lVar5,KeepSize);
    }
    pDVar2 = (__return_storage_ptr__->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    str = *(QString **)(this + 8);
    lVar5 = *(long *)(this + 0x10);
    QString::append(__return_storage_ptr__,str);
    if (lVar5 != 1) {
      lVar5 = lVar5 * 0x18 + -0x18;
      do {
        str = str + 1;
        str_00.m_size = (qsizetype)pcVar4;
        str_00.m_data = (char *)list;
        QString::append(__return_storage_ptr__,str_00);
        QString::append(__return_storage_ptr__,str);
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList &list, QLatin1StringView sep)
{
    QString result;
    if (!list.isEmpty()) {
        result.reserve(accumulatedSize(list, sep.size()));
        const auto end = list.end();
        auto it = list.begin();
        result += *it;
        while (++it != end) {
            result += sep;
            result += *it;
        }
    }
    return result;
}